

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::ValidationState_t::CooperativeMatrixShapesMatch
          (ValidationState_t *this,Instruction *inst,uint32_t m1,uint32_t m2)

{
  undefined4 uVar1;
  _Head_base<1UL,_bool,_false> _Var2;
  uint uVar3;
  uint uVar4;
  uint id;
  uint id_00;
  uint id_01;
  uint id_02;
  Instruction *this_00;
  Instruction *this_01;
  char *pcVar5;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  this_00 = FindDef(this,m1);
  this_01 = FindDef(this,m2);
  if ((this_00->inst_).opcode == (this_01->inst_).opcode) {
    uVar3 = Instruction::GetOperandAs<unsigned_int>(this_00,2);
    uVar4 = Instruction::GetOperandAs<unsigned_int>(this_00,3);
    id = Instruction::GetOperandAs<unsigned_int>(this_00,4);
    id_00 = Instruction::GetOperandAs<unsigned_int>(this_01,2);
    id_01 = Instruction::GetOperandAs<unsigned_int>(this_01,3);
    id_02 = Instruction::GetOperandAs<unsigned_int>(this_01,4);
    EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,uVar3);
    _Var2._M_head_impl = local_208[4];
    uVar1 = local_208._0_4_;
    EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id_00);
    if (((_Var2._M_head_impl == true) && (local_208[4] != false)) && (uVar1 != local_208._0_4_)) {
      diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
      pcVar5 = "Expected scopes of Matrix and Result Type to be ";
    }
    else {
      EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,uVar4);
      _Var2._M_head_impl = local_208[4];
      uVar1 = local_208._0_4_;
      EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id_01);
      if (((_Var2._M_head_impl == true) && (local_208[4] != false)) && (uVar1 != local_208._0_4_)) {
        diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
        pcVar5 = "Expected rows of Matrix type and Result Type to be ";
      }
      else {
        EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id);
        _Var2._M_head_impl = local_208[4];
        uVar1 = local_208._0_4_;
        EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id_02);
        if (((_Var2._M_head_impl == true) && (local_208[4] != false)) && (uVar1 != local_208._0_4_))
        {
          diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
          pcVar5 = "Expected columns of Matrix type and Result Type to be ";
        }
        else {
          if ((this_00->inst_).opcode != 0x1168) {
            return SPV_SUCCESS;
          }
          uVar3 = Instruction::GetOperandAs<unsigned_int>(this_00,5);
          uVar4 = Instruction::GetOperandAs<unsigned_int>(this_01,5);
          EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,uVar3);
          _Var2._M_head_impl = local_208[4];
          uVar1 = local_208._0_4_;
          EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,uVar4);
          if (_Var2._M_head_impl != true) {
            return SPV_SUCCESS;
          }
          if (local_208[4] == false) {
            return SPV_SUCCESS;
          }
          if (uVar1 == local_208._0_4_) {
            return SPV_SUCCESS;
          }
          diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
          pcVar5 = "Expected Use of Matrix type and Result Type to be ";
        }
      }
    }
    std::operator<<((ostream *)local_208,pcVar5);
    pcVar5 = "identical";
  }
  else {
    diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
    pcVar5 = "Expected cooperative matrix types";
  }
  std::operator<<((ostream *)local_208,pcVar5);
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return local_38;
}

Assistant:

spv_result_t ValidationState_t::CooperativeMatrixShapesMatch(
    const Instruction* inst, uint32_t m1, uint32_t m2) {
  const auto m1_type = FindDef(m1);
  const auto m2_type = FindDef(m2);

  if (m1_type->opcode() != m2_type->opcode()) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected cooperative matrix types";
  }

  uint32_t m1_scope_id = m1_type->GetOperandAs<uint32_t>(2);
  uint32_t m1_rows_id = m1_type->GetOperandAs<uint32_t>(3);
  uint32_t m1_cols_id = m1_type->GetOperandAs<uint32_t>(4);

  uint32_t m2_scope_id = m2_type->GetOperandAs<uint32_t>(2);
  uint32_t m2_rows_id = m2_type->GetOperandAs<uint32_t>(3);
  uint32_t m2_cols_id = m2_type->GetOperandAs<uint32_t>(4);

  bool m1_is_int32 = false, m1_is_const_int32 = false, m2_is_int32 = false,
       m2_is_const_int32 = false;
  uint32_t m1_value = 0, m2_value = 0;

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_scope_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_scope_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected scopes of Matrix and Result Type to be "
           << "identical";
  }

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_rows_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_rows_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected rows of Matrix type and Result Type to be "
           << "identical";
  }

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_cols_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_cols_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected columns of Matrix type and Result Type to be "
           << "identical";
  }

  if (m1_type->opcode() == spv::Op::OpTypeCooperativeMatrixKHR) {
    uint32_t m1_use_id = m1_type->GetOperandAs<uint32_t>(5);
    uint32_t m2_use_id = m2_type->GetOperandAs<uint32_t>(5);
    std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
        EvalInt32IfConst(m1_use_id);
    std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
        EvalInt32IfConst(m2_use_id);

    if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
      return diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Use of Matrix type and Result Type to be "
             << "identical";
    }
  }

  return SPV_SUCCESS;
}